

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O0

void __thiscall
CTxMemPoolEntry::CTxMemPoolEntry
          (CTxMemPoolEntry *this,CTransactionRef *tx,CAmount fee,int64_t time,uint entry_height,
          uint64_t entry_sequence,bool spends_coinbase,int64_t sigops_cost,LockPoints lp)

{
  long lVar1;
  int32_t iVar2;
  size_t sVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  CTxMemPoolEntry *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::shared_ptr<const_CTransaction>::shared_ptr
            (&in_stack_ffffffffffffff48->tx,(shared_ptr<const_CTransaction> *)0xeb1ab0);
  std::
  set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::set((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
         *)in_stack_ffffffffffffff48);
  std::
  set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::set((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
         *)in_stack_ffffffffffffff48);
  *(undefined8 *)(in_RDI + 0x70) = in_RDX;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  iVar2 = GetTransactionWeight((CTransaction *)in_stack_ffffffffffffff48);
  *(int32_t *)(in_RDI + 0x78) = iVar2;
  sVar3 = RecursiveDynamicUsage<CTransaction_const>
                    ((shared_ptr<const_CTransaction> *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  *(size_t *)(in_RDI + 0x80) = sVar3;
  *(undefined8 *)(in_RDI + 0x88) = in_RCX;
  *(undefined8 *)(in_RDI + 0x90) = in_R9;
  *(undefined4 *)(in_RDI + 0x98) = in_R8D;
  *(byte *)(in_RDI + 0x9c) = in_stack_00000008 & 1;
  *(undefined8 *)(in_RDI + 0xa0) = in_stack_00000010;
  *(undefined8 *)(in_RDI + 0xa8) = *(undefined8 *)(in_RDI + 0x70);
  *(undefined8 *)(in_RDI + 0xc0) = in_stack_00000028;
  *(undefined8 *)(in_RDI + 0xb0) = in_stack_00000018;
  *(undefined8 *)(in_RDI + 0xb8) = in_stack_00000020;
  *(undefined8 *)(in_RDI + 200) = 1;
  iVar2 = GetTxSize(in_stack_ffffffffffffff48);
  *(long *)(in_RDI + 0xd0) = (long)iVar2;
  *(undefined8 *)(in_RDI + 0xd8) = *(undefined8 *)(in_RDI + 0x70);
  *(undefined8 *)(in_RDI + 0xe0) = 1;
  iVar2 = GetTxSize(in_stack_ffffffffffffff48);
  *(long *)(in_RDI + 0xe8) = (long)iVar2;
  *(undefined8 *)(in_RDI + 0xf0) = *(undefined8 *)(in_RDI + 0x70);
  *(undefined8 *)(in_RDI + 0xf8) = *(undefined8 *)(in_RDI + 0xa0);
  Epoch::Marker::Marker((Marker *)in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxMemPoolEntry(const CTransactionRef& tx, CAmount fee,
                    int64_t time, unsigned int entry_height, uint64_t entry_sequence,
                    bool spends_coinbase,
                    int64_t sigops_cost, LockPoints lp)
        : tx{tx},
          nFee{fee},
          nTxWeight{GetTransactionWeight(*tx)},
          nUsageSize{RecursiveDynamicUsage(tx)},
          nTime{time},
          entry_sequence{entry_sequence},
          entryHeight{entry_height},
          spendsCoinbase{spends_coinbase},
          sigOpCost{sigops_cost},
          m_modified_fee{nFee},
          lockPoints{lp},
          nSizeWithDescendants{GetTxSize()},
          nModFeesWithDescendants{nFee},
          nSizeWithAncestors{GetTxSize()},
          nModFeesWithAncestors{nFee},
          nSigOpCostWithAncestors{sigOpCost} {}